

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayFBOIncompleteness.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayFBOIncompleteness::initTest(TextureCubeMapArrayFBOIncompleteness *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  string local_40;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x6f8))(1,&this->m_small_to_id);
    (**(code **)(lVar3 + 0x6f8))(1,&this->m_lots_of_layers_to_id);
    (**(code **)(lVar3 + 0x6f8))(1,&this->m_non_layered_to_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenTextures() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayFBOIncompleteness.cpp"
                    ,0x95);
    (**(code **)(lVar3 + 0x6d0))(1,&this->m_fbo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenFramebuffers() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayFBOIncompleteness.cpp"
                    ,0x99);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Texture cube map array functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayFBOIncompleteness::initTest()
{
	/* Check if texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve GL entry point */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create texture objects.*/
	gl.genTextures(1, &m_small_to_id);
	gl.genTextures(1, &m_lots_of_layers_to_id);
	gl.genTextures(1, &m_non_layered_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed");

	/* Create a framebuffer object we will use for the test */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed");
}